

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O2

QStringList * __thiscall
QtPrivate::QCalendarRegistry::availableCalendars
          (QStringList *__return_storage_ptr__,QCalendarRegistry *this)

{
  long in_FS_OFFSET;
  QReadLocker local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ensurePopulated(this);
  local_28.q_val = (quintptr)this;
  QReadLocker::relock(&local_28);
  QArrayDataPointer<QString>::QArrayDataPointer
            (&__return_storage_ptr__->d,(QArrayDataPointer<QString> *)&this->byName);
  QReadLocker::~QReadLocker(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCalendarRegistry::availableCalendars()
{
    ensurePopulated();

    QReadLocker locker(&lock);
    return byName.keys();
}